

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_statement.cpp
# Opt level: O3

void __thiscall
duckdb::ExecuteStatement::ExecuteStatement(ExecuteStatement *this,ExecuteStatement *other)

{
  pointer pcVar1;
  pointer pPVar2;
  _Hash_node_base *p_Var3;
  long *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  string *local_60;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  long *local_38;
  
  SQLStatement::SQLStatement(&this->super_SQLStatement,&other->super_SQLStatement);
  (this->super_SQLStatement)._vptr_SQLStatement = (_func_int **)&PTR__ExecuteStatement_01981bd8;
  local_60 = &this->name;
  local_68 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)local_68;
  pcVar1 = (other->name)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,pcVar1,pcVar1 + (other->name)._M_string_length);
  (this->named_values)._M_h._M_buckets = &(this->named_values)._M_h._M_single_bucket;
  (this->named_values)._M_h._M_bucket_count = 1;
  (this->named_values)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->named_values)._M_h._M_element_count = 0;
  (this->named_values)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->named_values)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->named_values)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var3 = (other->named_values)._M_h._M_before_begin._M_nxt;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    do {
      pPVar2 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)(p_Var3 + 5));
      (*(pPVar2->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_70,pPVar2);
      local_58[0] = local_48;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,p_Var3[1]._M_nxt,
                 (long)&(p_Var3[1]._M_nxt)->_M_nxt + (long)&(p_Var3[2]._M_nxt)->_M_nxt);
      local_38 = local_70;
      local_70 = (long *)0x0;
      ::std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_emplace<std::pair<std::__cxx11::string,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&this->named_values,(string *)local_58);
      if (local_38 != (long *)0x0) {
        (**(code **)(*local_38 + 8))();
      }
      local_38 = (long *)0x0;
      if (local_58[0] != local_48) {
        operator_delete(local_58[0]);
      }
      if (local_70 != (long *)0x0) {
        (**(code **)(*local_70 + 8))();
      }
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

ExecuteStatement::ExecuteStatement(const ExecuteStatement &other) : SQLStatement(other), name(other.name) {
	for (const auto &item : other.named_values) {
		named_values.emplace(std::make_pair(item.first, item.second->Copy()));
	}
}